

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

spv_result_t
spvTextToBinaryWithOptions
          (spv_const_context context,char *input_text,size_t input_text_size,uint32_t options,
          spv_binary *pBinary,spv_diagnostic *pDiagnostic)

{
  pointer __src;
  undefined1 auVar1 [16];
  undefined4 env;
  pointer psVar2;
  bool bVar3;
  spv_result_t sVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  spv_instruction_t *inst_1;
  pointer psVar7;
  uint32_t *puVar8;
  spv_binary psVar9;
  size_t __n;
  long lVar10;
  iterator __end1;
  ulong uVar11;
  iterator __begin1;
  pointer psVar12;
  undefined1 local_418 [24];
  spv_ext_inst_table local_400;
  spv_text_t text;
  vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> instructions;
  spv_context_t hijack_context;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> ids_to_preserve;
  AssemblyContext context_1;
  spv_instruction_t inst;
  spv_result_t local_38;
  
  spv_context_t::spv_context_t(&hijack_context,context);
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context,pDiagnostic);
  }
  local_418._0_4_ = hijack_context.target_env;
  local_418._8_8_ = hijack_context.operand_table;
  local_418._16_4_ = (int)hijack_context.opcode_table;
  local_418._20_4_ = hijack_context.opcode_table._4_4_;
  ids_to_preserve._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ids_to_preserve._M_t._M_impl.super__Rb_tree_header._M_header;
  ids_to_preserve._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ids_to_preserve._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_400 = hijack_context.ext_inst_table;
  ids_to_preserve._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  text.str = input_text;
  text.length = input_text_size;
  ids_to_preserve._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ids_to_preserve._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((options & 2) != 0) {
    inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &inst.resultTypeId;
    inst.opcode = OpNop;
    inst.extInstType = SPV_EXT_INST_TYPE_NONE;
    inst.resultTypeId = 0;
    inst._12_4_ = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._0_16_ = auVar1 << 0x40;
    spvtools::AssemblyContext::AssemblyContext
              (&context_1,&text,&hijack_context.consumer,
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&inst);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&inst);
    if (text.str == (char *)0x0) {
      spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&inst,&context_1);
      std::operator<<((ostream *)&inst,"Missing assembly text.");
      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&inst);
      sVar4 = local_38;
    }
    else {
      bVar3 = spvtools::AssemblyGrammar::isValid((AssemblyGrammar *)local_418);
      if (bVar3) {
        spvtools::AssemblyContext::advance(&context_1);
        do {
          bVar3 = spvtools::AssemblyContext::hasText(&context_1);
          if (!bVar3) break;
          inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          inst.opcode = Max;
          sVar4 = anon_unknown.dwarf_257ce77::spvTextEncodeOpcode
                            ((AssemblyGrammar *)local_418,&context_1,&inst);
          if (sVar4 != SPV_SUCCESS) {
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            sVar4 = SPV_ERROR_INVALID_TEXT;
            goto LAB_00517047;
          }
          sVar4 = spvtools::AssemblyContext::advance(&context_1);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        } while (sVar4 == SPV_SUCCESS);
        spvtools::AssemblyContext::GetNumericIds
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &inst,&context_1);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_move_assign(&ids_to_preserve._M_t,&inst);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&inst);
        sVar4 = SPV_SUCCESS;
      }
      else {
        sVar4 = SPV_ERROR_INVALID_TABLE;
      }
    }
LAB_00517047:
    spvtools::AssemblyContext::~AssemblyContext(&context_1);
    if (sVar4 != SPV_SUCCESS) goto LAB_00517281;
  }
  spvtools::AssemblyContext::AssemblyContext
            (&context_1,&text,&hijack_context.consumer,&ids_to_preserve);
  if (text.str == (char *)0x0) {
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&inst,&context_1);
    std::operator<<((ostream *)&inst,"Missing assembly text.");
    spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&inst);
    sVar4 = local_38;
  }
  else {
    bVar3 = spvtools::AssemblyGrammar::isValid((AssemblyGrammar *)local_418);
    if (bVar3) {
      if (pBinary == (spv_binary *)0x0) {
        sVar4 = SPV_ERROR_INVALID_POINTER;
      }
      else {
        instructions.super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        instructions.super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        instructions.super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        spvtools::AssemblyContext::advance(&context_1);
        do {
          bVar3 = spvtools::AssemblyContext::hasText(&context_1);
          if (!bVar3) break;
          inst._0_12_ = ZEXT812(0);
          inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::
          emplace_back<spv_instruction_t>(&instructions,&inst);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          sVar4 = anon_unknown.dwarf_257ce77::spvTextEncodeOpcode
                            ((AssemblyGrammar *)local_418,&context_1,
                             instructions.
                             super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
          if (sVar4 != SPV_SUCCESS) goto LAB_00517260;
          sVar4 = spvtools::AssemblyContext::advance(&context_1);
        } while (sVar4 == SPV_SUCCESS);
        psVar12 = instructions.
                  super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        psVar2 = instructions.
                 super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar11 = 5;
        for (psVar7 = instructions.
                      super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            psVar7 != instructions.
                      super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish; psVar7 = psVar7 + 1) {
          uVar11 = uVar11 + ((long)(psVar7->words).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(psVar7->words).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
        }
        puVar8 = (uint32_t *)operator_new__(-(ulong)(uVar11 >> 0x3e != 0) | uVar11 * 4);
        lVar10 = 5;
        for (; env = local_418._0_4_, psVar12 != psVar2; psVar12 = psVar12 + 1) {
          __src = (psVar12->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
          __n = (long)(psVar12->words).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src;
          memcpy(puVar8 + lVar10,__src,__n);
          lVar10 = lVar10 + ((long)__n >> 2);
        }
        uVar5 = spvtools::AssemblyContext::getBound(&context_1);
        *puVar8 = 0x7230203;
        uVar6 = spvVersionForTargetEnv(env);
        puVar8[1] = uVar6;
        puVar8[2] = 0x70000;
        puVar8[3] = uVar5;
        puVar8[4] = 0;
        psVar9 = (spv_binary)operator_new(0x10);
        psVar9->code = puVar8;
        psVar9->wordCount = uVar11;
        *pBinary = psVar9;
        sVar4 = SPV_SUCCESS;
LAB_00517260:
        std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::~vector(&instructions);
      }
    }
    else {
      sVar4 = SPV_ERROR_INVALID_TABLE;
    }
  }
  spvtools::AssemblyContext::~AssemblyContext(&context_1);
LAB_00517281:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&ids_to_preserve._M_t);
  if ((pDiagnostic != (spv_diagnostic *)0x0) && (*pDiagnostic != (spv_diagnostic)0x0)) {
    (*pDiagnostic)->isTextSource = true;
  }
  if (hijack_context.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*hijack_context.consumer.super__Function_base._M_manager)
              ((_Any_data *)&hijack_context.consumer,(_Any_data *)&hijack_context.consumer,
               __destroy_functor);
  }
  return sVar4;
}

Assistant:

spv_result_t spvTextToBinaryWithOptions(const spv_const_context context,
                                        const char* input_text,
                                        const size_t input_text_size,
                                        const uint32_t options,
                                        spv_binary* pBinary,
                                        spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  spv_text_t text = {input_text, input_text_size};
  spvtools::AssemblyGrammar grammar(&hijack_context);

  spv_result_t result = spvTextToBinaryInternal(
      grammar, hijack_context.consumer, &text, options, pBinary);
  if (pDiagnostic && *pDiagnostic) (*pDiagnostic)->isTextSource = true;

  return result;
}